

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char,char(&)[46],char_const(&)[3],unsigned_short>
          (String *__return_storage_ptr__,kj *this,char *params,char (*params_1) [46],
          char (*params_2) [3],unsigned_short *params_3)

{
  kj local_59;
  CappedArray<char,_8UL> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  
  local_59 = *this;
  local_38 = toCharSequence<char(&)[46]>((char (*) [46])params);
  local_48 = toCharSequence<char_const(&)[3]>((char (*) [3])params_1);
  local_58 = toCharSequence<unsigned_short>((unsigned_short *)params_2);
  _::
  concat<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>>
            (__return_storage_ptr__,(_ *)&local_59,(FixedArray<char,_1UL> *)&local_38,&local_48,
             (ArrayPtr<const_char> *)&local_58,(CappedArray<char,_8UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}